

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

player_t * __thiscall player_t::operator=(player_t *this,player_t *p)

{
  short sVar1;
  short sVar2;
  short sVar3;
  undefined2 uVar4;
  player_t *p_local;
  player_t *this_local;
  
  this->mo = p->mo;
  this->playerstate = p->playerstate;
  sVar1 = (p->cmd).ucmd.pitch;
  sVar2 = (p->cmd).ucmd.yaw;
  (this->cmd).ucmd.buttons = (p->cmd).ucmd.buttons;
  (this->cmd).ucmd.pitch = sVar1;
  (this->cmd).ucmd.yaw = sVar2;
  sVar1 = (p->cmd).ucmd.forwardmove;
  sVar2 = (p->cmd).ucmd.sidemove;
  sVar3 = (p->cmd).ucmd.upmove;
  (this->cmd).ucmd.roll = (p->cmd).ucmd.roll;
  (this->cmd).ucmd.forwardmove = sVar1;
  (this->cmd).ucmd.sidemove = sVar2;
  (this->cmd).ucmd.upmove = sVar3;
  uVar4 = *(undefined2 *)&(p->cmd).field_0x12;
  (this->cmd).consistancy = (p->cmd).consistancy;
  *(undefined2 *)&(this->cmd).field_0x12 = uVar4;
  sVar1 = (p->original_cmd).pitch;
  sVar2 = (p->original_cmd).yaw;
  (this->original_cmd).buttons = (p->original_cmd).buttons;
  (this->original_cmd).pitch = sVar1;
  (this->original_cmd).yaw = sVar2;
  sVar1 = (p->original_cmd).forwardmove;
  sVar2 = (p->original_cmd).sidemove;
  sVar3 = (p->original_cmd).upmove;
  (this->original_cmd).roll = (p->original_cmd).roll;
  (this->original_cmd).forwardmove = sVar1;
  (this->original_cmd).sidemove = sVar2;
  (this->original_cmd).upmove = sVar3;
  this->original_oldbuttons = p->original_oldbuttons;
  this->cls = p->cls;
  this->DesiredFOV = p->DesiredFOV;
  this->FOV = p->FOV;
  this->viewz = p->viewz;
  this->viewheight = p->viewheight;
  this->deltaviewheight = p->deltaviewheight;
  this->bob = p->bob;
  TVector2<double>::operator=(&this->Vel,&p->Vel);
  this->centering = (bool)(p->centering & 1);
  this->turnticks = p->turnticks;
  this->attackdown = (bool)(p->attackdown & 1);
  this->usedown = (bool)(p->usedown & 1);
  this->oldbuttons = p->oldbuttons;
  this->health = p->health;
  this->inventorytics = p->inventorytics;
  this->CurrentPlayerClass = p->CurrentPlayerClass;
  *(undefined8 *)this->frags = *(undefined8 *)p->frags;
  *(undefined8 *)(this->frags + 2) = *(undefined8 *)(p->frags + 2);
  *(undefined8 *)(this->frags + 4) = *(undefined8 *)(p->frags + 4);
  *(undefined8 *)(this->frags + 6) = *(undefined8 *)(p->frags + 6);
  this->fragcount = p->fragcount;
  this->lastkilltime = p->lastkilltime;
  this->multicount = p->multicount;
  this->spreecount = p->spreecount;
  this->WeaponState = p->WeaponState;
  this->ReadyWeapon = p->ReadyWeapon;
  this->PendingWeapon = p->PendingWeapon;
  this->cheats = p->cheats;
  this->timefreezer = p->timefreezer;
  this->refire = p->refire;
  this->inconsistant = p->inconsistant;
  this->waiting = (bool)(p->waiting & 1);
  this->killcount = p->killcount;
  this->itemcount = p->itemcount;
  this->secretcount = p->secretcount;
  this->damagecount = p->damagecount;
  this->bonuscount = p->bonuscount;
  this->hazardcount = p->hazardcount;
  FName::operator=(&this->hazardtype,&p->hazardtype);
  this->hazardinterval = p->hazardinterval;
  this->poisoncount = p->poisoncount;
  FName::operator=(&this->poisontype,&p->poisontype);
  FName::operator=(&this->poisonpaintype,&p->poisonpaintype);
  (this->poisoner).field_0 = (p->poisoner).field_0;
  (this->attacker).field_0 = (p->attacker).field_0;
  this->extralight = p->extralight;
  this->fixedcolormap = p->fixedcolormap;
  this->fixedlightlevel = p->fixedlightlevel;
  (this->psprites).field_0 = (p->psprites).field_0;
  this->morphTics = p->morphTics;
  this->MorphedPlayerClass = p->MorphedPlayerClass;
  this->MorphStyle = p->MorphStyle;
  this->MorphExitFlash = p->MorphExitFlash;
  (this->PremorphWeapon).field_0 = (p->PremorphWeapon).field_0;
  this->chickenPeck = p->chickenPeck;
  this->jumpTics = p->jumpTics;
  this->onground = (bool)(p->onground & 1);
  this->respawn_time = p->respawn_time;
  (this->camera).field_0 = (p->camera).field_0;
  this->air_finished = p->air_finished;
  FName::operator=(&this->LastDamageType,&p->LastDamageType);
  (this->Bot).field_0 = (p->Bot).field_0;
  this->settings_controller = (bool)(p->settings_controller & 1);
  this->BlendR = p->BlendR;
  this->BlendG = p->BlendG;
  this->BlendB = p->BlendB;
  this->BlendA = p->BlendA;
  FString::operator=(&this->LogText,&p->LogText);
  TAngle<double>::operator=(&this->MinPitch,&p->MinPitch);
  TAngle<double>::operator=(&this->MaxPitch,&p->MaxPitch);
  this->crouching = p->crouching;
  this->crouchdir = p->crouchdir;
  this->crouchfactor = p->crouchfactor;
  this->crouchoffset = p->crouchoffset;
  this->crouchviewdelta = p->crouchviewdelta;
  FWeaponSlots::operator=(&this->weapons,&p->weapons);
  (this->ConversationNPC).field_0 = (p->ConversationNPC).field_0;
  (this->ConversationPC).field_0 = (p->ConversationPC).field_0;
  TAngle<double>::operator=(&this->ConversationNPCAngle,&p->ConversationNPCAngle);
  this->ConversationFaceTalker = (bool)(p->ConversationFaceTalker & 1);
  (this->MUSINFOactor).field_0 = (p->MUSINFOactor).field_0;
  this->MUSINFOtics = p->MUSINFOtics;
  return this;
}

Assistant:

player_t &player_t::operator=(const player_t &p)
{
	mo = p.mo;
	playerstate = p.playerstate;
	cmd = p.cmd;
	original_cmd = p.original_cmd;
	original_oldbuttons = p.original_oldbuttons;
	// Intentionally not copying userinfo!
	cls = p.cls;
	DesiredFOV = p.DesiredFOV;
	FOV = p.FOV;
	viewz = p.viewz;
	viewheight = p.viewheight;
	deltaviewheight = p.deltaviewheight;
	bob = p.bob;
	Vel = p.Vel;
	centering = p.centering;
	turnticks = p.turnticks;
	attackdown = p.attackdown;
	usedown = p.usedown;
	oldbuttons = p.oldbuttons;
	health = p.health;
	inventorytics = p.inventorytics;
	CurrentPlayerClass = p.CurrentPlayerClass;
	memcpy(frags, &p.frags, sizeof(frags));
	fragcount = p.fragcount;
	lastkilltime = p.lastkilltime;
	multicount = p.multicount;
	spreecount = p.spreecount;
	WeaponState = p.WeaponState;
	ReadyWeapon = p.ReadyWeapon;
	PendingWeapon = p.PendingWeapon;
	cheats = p.cheats;
	timefreezer = p.timefreezer;
	refire = p.refire;
	inconsistant = p.inconsistant;
	waiting = p.waiting;
	killcount = p.killcount;
	itemcount = p.itemcount;
	secretcount = p.secretcount;
	damagecount = p.damagecount;
	bonuscount = p.bonuscount;
	hazardcount = p.hazardcount;
	hazardtype = p.hazardtype;
	hazardinterval = p.hazardinterval;
	poisoncount = p.poisoncount;
	poisontype = p.poisontype;
	poisonpaintype = p.poisonpaintype;
	poisoner = p.poisoner;
	attacker = p.attacker;
	extralight = p.extralight;
	fixedcolormap = p.fixedcolormap;
	fixedlightlevel = p.fixedlightlevel;
	psprites = p.psprites;
	morphTics = p.morphTics;
	MorphedPlayerClass = p.MorphedPlayerClass;
	MorphStyle = p.MorphStyle;
	MorphExitFlash = p.MorphExitFlash;
	PremorphWeapon = p.PremorphWeapon;
	chickenPeck = p.chickenPeck;
	jumpTics = p.jumpTics;
	onground = p.onground;
	respawn_time = p.respawn_time;
	camera = p.camera;
	air_finished = p.air_finished;
	LastDamageType = p.LastDamageType;
	Bot = p.Bot;
	settings_controller = p.settings_controller;
	BlendR = p.BlendR;
	BlendG = p.BlendG;
	BlendB = p.BlendB;
	BlendA = p.BlendA;
	LogText = p.LogText;
	MinPitch = p.MinPitch;
	MaxPitch = p.MaxPitch;
	crouching = p.crouching;
	crouchdir = p.crouchdir;
	crouchfactor = p.crouchfactor;
	crouchoffset = p.crouchoffset;
	crouchviewdelta = p.crouchviewdelta;
	weapons = p.weapons;
	ConversationNPC = p.ConversationNPC;
	ConversationPC = p.ConversationPC;
	ConversationNPCAngle = p.ConversationNPCAngle;
	ConversationFaceTalker = p.ConversationFaceTalker;
	MUSINFOactor = p.MUSINFOactor;
	MUSINFOtics = p.MUSINFOtics;
	return *this;
}